

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineFuel.cpp
# Opt level: O1

bool __thiscall DIS::EngineFuel::operator==(EngineFuel *this,EngineFuel *rhs)

{
  return (((this->_padding == rhs->_padding && rhs->_fuelLocation == this->_fuelLocation) &&
          rhs->_fuelType == this->_fuelType) &&
         rhs->_fuelMeasurementUnits == this->_fuelMeasurementUnits) &&
         this->_fuelQuantity == rhs->_fuelQuantity;
}

Assistant:

bool EngineFuel::operator ==(const EngineFuel& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_fuelQuantity == rhs._fuelQuantity) ) ivarsEqual = false;
     if( ! (_fuelMeasurementUnits == rhs._fuelMeasurementUnits) ) ivarsEqual = false;
     if( ! (_fuelType == rhs._fuelType) ) ivarsEqual = false;
     if( ! (_fuelLocation == rhs._fuelLocation) ) ivarsEqual = false;
     if( ! (_padding == rhs._padding) ) ivarsEqual = false;

    return ivarsEqual;
 }